

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O0

void * gdImageWBMPPtr(gdImagePtr im,int *size,int fg)

{
  int iVar1;
  gdIOCtx *out_00;
  gdIOCtx *out;
  void *rv;
  int fg_local;
  int *size_local;
  gdImagePtr im_local;
  
  out_00 = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out_00 == (gdIOCtx *)0x0) {
    im_local = (gdImagePtr)0x0;
  }
  else {
    iVar1 = _gdImageWBMPCtx(im,fg,out_00);
    if (iVar1 == 0) {
      out = (gdIOCtx *)gdDPExtractData(out_00,size);
    }
    else {
      out = (gdIOCtx *)0x0;
    }
    (*out_00->gd_free)(out_00);
    im_local = (gdImagePtr)out;
  }
  return im_local;
}

Assistant:

BGD_DECLARE(void *) gdImageWBMPPtr(gdImagePtr im, int *size, int fg)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx(2048, NULL);
	if (out == NULL) return NULL;
	if (!_gdImageWBMPCtx(im, fg, out)) {
		rv = gdDPExtractData(out, size);
	} else {
		rv = NULL;
	}
	out->gd_free(out);
	return rv;
}